

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O1

void __thiscall
FIX::DataDictionary::checkHasRequired
          (DataDictionary *this,FieldMap *header,FieldMap *body,FieldMap *trailer,MsgType *msgType)

{
  string *__k;
  _Rb_tree_color _Var1;
  _Base_ptr p_Var2;
  FieldMap *header_00;
  DataDictionary *pDVar3;
  NonBodyFields *pNVar4;
  bool bVar5;
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  _Var6;
  _Rb_tree_node_base *p_Var7;
  const_iterator cVar8;
  RequiredTagMissing *pRVar9;
  _Base_ptr p_Var10;
  DataDictionary *DD;
  int delim;
  string local_60;
  DataDictionary *local_40;
  int local_34;
  
  p_Var7 = (this->m_headerFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = this;
  while( true ) {
    if ((_Rb_tree_header *)p_Var7 == &(this->m_headerFields)._M_t._M_impl.super__Rb_tree_header) {
      p_Var7 = (local_40->m_trailerFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pNVar4 = &local_40->m_trailerFields;
      pDVar3 = local_40;
      while( true ) {
        local_40 = pDVar3;
        if ((_Rb_tree_header *)p_Var7 == &(pNVar4->_M_t)._M_impl.super__Rb_tree_header) {
          __k = &(msgType->super_StringField).super_FieldBase.m_string;
          cVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                  ::find(&(pDVar3->m_requiredFields)._M_t,__k);
          if ((_Rb_tree_header *)cVar8._M_node !=
              &(pDVar3->m_requiredFields)._M_t._M_impl.super__Rb_tree_header) {
            for (p_Var7 = cVar8._M_node[2]._M_right;
                p_Var7 != (_Rb_tree_node_base *)&cVar8._M_node[2]._M_parent;
                p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
              _Var6 = FieldMap::
                      lookup<__gnu_cxx::__normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>>
                                (body,(body->m_fields).
                                      super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                 (body->m_fields).
                                 super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,p_Var7[1]._M_color);
              if (_Var6._M_current ==
                  (body->m_fields).
                  super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                pRVar9 = (RequiredTagMissing *)__cxa_allocate_exception(0x58);
                _Var1 = p_Var7[1]._M_color;
                local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
                RequiredTagMissing::RequiredTagMissing(pRVar9,_Var1,&local_60);
                __cxa_throw(pRVar9,&RequiredTagMissing::typeinfo,FIX::Exception::~Exception);
              }
            }
            for (p_Var7 = (body->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var7 != &(body->m_groups)._M_t._M_impl.super__Rb_tree_header;
                p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
              local_60._M_dataplus._M_p = (pointer)0x0;
              bVar5 = getGroup(local_40,__k,p_Var7[1]._M_color,&local_34,
                               (DataDictionary **)&local_60);
              if (bVar5) {
                p_Var2 = p_Var7[1]._M_left;
                for (p_Var10 = p_Var7[1]._M_parent; p_Var10 != p_Var2;
                    p_Var10 = (_Base_ptr)&p_Var10->_M_parent) {
                  header_00 = *(FieldMap **)p_Var10;
                  checkHasRequired((DataDictionary *)local_60._M_dataplus._M_p,header_00,header_00,
                                   header_00,msgType);
                }
              }
            }
          }
          return;
        }
        if ((p_Var7[1].field_0x4 == '\x01') &&
           (_Var6 = FieldMap::
                    lookup<__gnu_cxx::__normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>>
                              (trailer,(trailer->m_fields).
                                       super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                               (trailer->m_fields).
                               super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
                               _M_impl.super__Vector_impl_data._M_finish,p_Var7[1]._M_color),
           _Var6._M_current ==
           (trailer->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
           _M_impl.super__Vector_impl_data._M_finish)) break;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
        pDVar3 = local_40;
      }
      pRVar9 = (RequiredTagMissing *)__cxa_allocate_exception(0x58);
      _Var1 = p_Var7[1]._M_color;
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
      RequiredTagMissing::RequiredTagMissing(pRVar9,_Var1,&local_60);
      __cxa_throw(pRVar9,&RequiredTagMissing::typeinfo,FIX::Exception::~Exception);
    }
    if ((p_Var7[1].field_0x4 == '\x01') &&
       (_Var6 = FieldMap::
                lookup<__gnu_cxx::__normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>>
                          (header,(header->m_fields).
                                  super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                           (header->m_fields).
                           super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
                           _M_impl.super__Vector_impl_data._M_finish,p_Var7[1]._M_color),
       _Var6._M_current ==
       (header->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
       _M_impl.super__Vector_impl_data._M_finish)) break;
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  }
  pRVar9 = (RequiredTagMissing *)__cxa_allocate_exception(0x58);
  _Var1 = p_Var7[1]._M_color;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  RequiredTagMissing::RequiredTagMissing(pRVar9,_Var1,&local_60);
  __cxa_throw(pRVar9,&RequiredTagMissing::typeinfo,FIX::Exception::~Exception);
}

Assistant:

EXCEPT(RequiredTagMissing) {
    for (const NonBodyFields::value_type &NBF : m_headerFields) {
      if (NBF.second == true && !header.isSetField(NBF.first)) {
        throw RequiredTagMissing(NBF.first);
      }
    }

    for (const NonBodyFields::value_type &NBF : m_trailerFields) {
      if (NBF.second == true && !trailer.isSetField(NBF.first)) {
        throw RequiredTagMissing(NBF.first);
      }
    }

    MsgTypeToField::const_iterator iM = m_requiredFields.find(msgType.getString());
    if (iM == m_requiredFields.end()) {
      return;
    }

    const MsgFields &fields = iM->second;
    MsgFields::const_iterator iF;
    for (const MsgFields::value_type &F : fields) {
      if (!body.isSetField(F)) {
        throw RequiredTagMissing(F);
      }
    }

    for (FieldMap::g_const_iterator groups = body.g_begin(); groups != body.g_end(); ++groups) {
      int delim;
      const DataDictionary *DD = 0;
      int field = groups->first;
      if (getGroup(msgType.getValue(), field, delim, DD)) {
        for (const FieldMap *group : groups->second) {
          DD->checkHasRequired(*group, *group, *group, msgType);
        }
      }
    }
  }